

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visitor.h
# Opt level: O1

bool Fixpp::impl::
     doVisitField<Fixpp::InstanceGroupRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>>::Visitor,0ul>
               (FieldRef<Fixpp::TagT<336U,_Fixpp::Type::String>_> *message,uint tag,Visitor *visitor
               )

{
  unsigned_long *puVar1;
  int local_1c [2];
  int index;
  
  local_1c[0] = -1;
  doVisitSingleField<0ul,Fixpp::FieldRef<Fixpp::TagT<336u,Fixpp::Type::String>>,Fixpp::impl::FieldParser<Fixpp::FieldRef<Fixpp::SmallRepeatingGroup<Fixpp::TagT<386u,Fixpp::Type::Int>,Fixpp::SizeHint<10ul>,Fixpp::TagT<336u,Fixpp::Type::String>>>>::Visitor>
            (tag,message,visitor,local_1c);
  if ((long)local_1c[0] != -1) {
    if (local_1c[0] != 0) {
      std::__throw_out_of_range_fmt
                ("%s: __position (which is %zu) >= _Nb (which is %zu)","bitset::set",
                 (long)local_1c[0],1);
    }
    puVar1 = &message[1].m_view.second;
    *(byte *)puVar1 = (byte)*puVar1 | 1;
  }
  return local_1c[0] != -1;
}

Assistant:

bool doVisitField(Message& message, unsigned tag, Visitor& visitor,
                          meta::seq::index_sequence<Indexes...>)
        {
            int index = -1;
            int dummy[] = {0, (doVisitSingleField<Indexes>(tag, meta::get<Indexes>(message.values), visitor, &index), 0)...};

            (void) dummy;
            (void) tag;
            (void) visitor;

            if (index != -1)
                message.allBits.set(static_cast<size_t>(index));

            return index != -1;
        }